

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

ly_bool lyd_validate_autodel_node_del
                  (lyd_node **first,lyd_node *del,lys_module *mod,int np_cont_diff,lyd_node **node,
                  ly_set *node_when,ly_set *node_types,lyd_node **diff)

{
  undefined8 uVar1;
  ly_bool lVar2;
  lys_module *local_68;
  lyd_node *LYD_TREE_DFS_next_1;
  lys_module *plStack_58;
  ly_bool LYD_TREE_DFS_continue_1;
  lyd_node *LYD_TREE_DFS_next;
  uint32_t local_48;
  ly_bool LYD_TREE_DFS_continue;
  uint32_t idx;
  ly_bool node_autodel;
  lyd_node *iter;
  ly_set *node_when_local;
  lyd_node **node_local;
  lys_module *plStack_20;
  int np_cont_diff_local;
  lys_module *mod_local;
  lyd_node *del_local;
  lyd_node **first_local;
  
  LYD_TREE_DFS_continue = '\0';
  iter = (lyd_node *)node_when;
  node_when_local = (ly_set *)node;
  node_local._4_4_ = np_cont_diff;
  plStack_20 = mod;
  mod_local = (lys_module *)del;
  del_local = (lyd_node *)first;
  lyd_del_move_root(first,del,mod);
  if ((node_when_local != (ly_set *)0x0) && (mod_local == *(lys_module **)node_when_local)) {
    uVar1 = *(undefined8 *)(*(long *)node_when_local + 0x18);
    node_when_local->size = (int)uVar1;
    node_when_local->count = (int)((ulong)uVar1 >> 0x20);
    LYD_TREE_DFS_continue = '\x01';
  }
  if (diff != (lyd_node **)0x0) {
    if (((node_local._4_4_ == 0) && (*(short *)mod_local->name == 1)) &&
       ((*(ushort *)(mod_local->name + 2) & 0x80) == 0)) {
      for (_idx = (lys_module *)lyd_child((lyd_node *)mod_local); _idx != (lys_module *)0x0;
          _idx = (lys_module *)_idx->ns) {
        lyd_val_diff_add((lyd_node *)_idx,LYD_DIFF_OP_DELETE,diff);
      }
    }
    else {
      lyd_val_diff_add((lyd_node *)mod_local,LYD_DIFF_OP_DELETE,diff);
    }
  }
  if ((iter != (lyd_node *)0x0) && (iter->flags != 0)) {
    _idx = mod_local;
    while (_idx != (lys_module *)0x0) {
      if ((mod_local != _idx) &&
         (lVar2 = ly_set_contains((ly_set *)iter,_idx,&local_48), lVar2 != '\0')) {
        ly_set_rm_index((ly_set *)iter,local_48,(_func_void_void_ptr *)0x0);
      }
      plStack_58 = (lys_module *)lyd_child((lyd_node *)_idx);
      if (plStack_58 == (lys_module *)0x0) {
        if (_idx == mod_local) break;
        plStack_58 = (lys_module *)_idx->ns;
      }
      while ((plStack_58 == (lys_module *)0x0 &&
             (_idx = (lys_module *)_idx->revision, _idx->revision != mod_local->revision))) {
        plStack_58 = (lys_module *)_idx->ns;
      }
      _idx = plStack_58;
    }
  }
  if ((node_types != (ly_set *)0x0) && (node_types->count != 0)) {
    _idx = mod_local;
    while (_idx != (lys_module *)0x0) {
      lVar2 = ly_set_contains(node_types,_idx,&local_48);
      if (lVar2 != '\0') {
        ly_set_rm_index(node_types,local_48,(_func_void_void_ptr *)0x0);
      }
      local_68 = (lys_module *)lyd_child((lyd_node *)_idx);
      if (local_68 == (lys_module *)0x0) {
        if (_idx == mod_local) break;
        local_68 = (lys_module *)_idx->ns;
      }
      while ((local_68 == (lys_module *)0x0 &&
             (_idx = (lys_module *)_idx->revision, _idx->revision != mod_local->revision))) {
        local_68 = (lys_module *)_idx->ns;
      }
      _idx = local_68;
    }
  }
  lyd_free_tree((lyd_node *)mod_local);
  return LYD_TREE_DFS_continue;
}

Assistant:

static ly_bool
lyd_validate_autodel_node_del(struct lyd_node **first, struct lyd_node *del, const struct lys_module *mod,
        int np_cont_diff, struct lyd_node **node, struct ly_set *node_when, struct ly_set *node_types, struct lyd_node **diff)
{
    struct lyd_node *iter;
    ly_bool node_autodel = 0;
    uint32_t idx;

    /* update pointers */
    lyd_del_move_root(first, del, mod);
    if (node && (del == *node)) {
        *node = (*node)->next;
        node_autodel = 1;
    }

    if (diff) {
        /* add into diff */
        if (!np_cont_diff && (del->schema->nodetype == LYS_CONTAINER) && !(del->schema->flags & LYS_PRESENCE)) {
            /* we do not want to track NP container changes, but remember any removed children */
            LY_LIST_FOR(lyd_child(del), iter) {
                lyd_val_diff_add(iter, LYD_DIFF_OP_DELETE, diff);
            }
        } else {
            lyd_val_diff_add(del, LYD_DIFF_OP_DELETE, diff);
        }
    }

    if (node_when && node_when->count) {
        /* remove nested from node_when set */
        LYD_TREE_DFS_BEGIN(del, iter) {
            if ((del != iter) && ly_set_contains(node_when, iter, &idx)) {
                ly_set_rm_index(node_when, idx, NULL);
            }
            LYD_TREE_DFS_END(del, iter);
        }
    }

    if (node_types && node_types->count) {
        /* remove from node_types set */
        LYD_TREE_DFS_BEGIN(del, iter) {
            if (ly_set_contains(node_types, iter, &idx)) {
                ly_set_rm_index(node_types, idx, NULL);
            }
            LYD_TREE_DFS_END(del, iter);
        }
    }

    /* free */
    lyd_free_tree(del);

    return node_autodel;
}